

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lz4.c
# Opt level: O1

int lz4_reader_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uchar *p;
  ssize_t avail;
  ssize_t sStack_8;
  
  piVar3 = (int *)__archive_read_filter_ahead(filter,0xb,&sStack_8);
  iVar1 = 0;
  iVar2 = 0;
  if (piVar3 != (int *)0x0) {
    if (*piVar3 == 0x184c2102) {
      iVar2 = 0x20;
    }
    else {
      iVar2 = iVar1;
      if ((((*piVar3 == 0x184d2204) && ((*(byte *)(piVar3 + 1) & 0xc2) == 0x40)) &&
          ((*(byte *)((long)piVar3 + 5) & 0x40) != 0)) &&
         (iVar2 = 0x30, (*(byte *)((long)piVar3 + 5) & 0x8f) != 0)) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
lz4_reader_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;
	uint32_t number;

	(void)self; /* UNUSED */

	/* Minimal lz4 archive is 11 bytes. */
	buffer = __archive_read_filter_ahead(filter, 11, &avail);
	if (buffer == NULL)
		return (0);

	/* First four bytes must be LZ4 magic numbers. */
	bits_checked = 0;
	if ((number = archive_le32dec(buffer)) == LZ4_MAGICNUMBER) {
		unsigned char flag, BD;

		bits_checked += 32;
		/* Next follows a stream descriptor. */
		/* Descriptor Flags. */
		flag = buffer[4];
		/* A version number must be "01". */
		if (((flag & 0xc0) >> 6) != 1)
			return (0);
		/* A reserved bit must be "0". */
		if (flag & 2)
			return (0);
		bits_checked += 8;
		BD = buffer[5];
		/* A block maximum size should be more than 3. */
		if (((BD & 0x70) >> 4) < 4)
			return (0);
		/* Reserved bits must be "0". */
		if (BD & ~0x70)
			return (0);
		bits_checked += 8;
	} else if (number == LZ4_LEGACY) {
		bits_checked += 32;
	}
	
	return (bits_checked);
}